

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_predictive_decoder.h
# Opt level: O1

bool __thiscall
draco::MeshEdgebreakerTraversalPredictiveDecoder::Start
          (MeshEdgebreakerTraversalPredictiveDecoder *this,DecoderBuffer *out_buffer)

{
  long lVar1;
  bool bVar2;
  uint in_EAX;
  undefined7 extraout_var;
  undefined8 uStack_18;
  int iVar3;
  
  uStack_18._0_4_ = in_EAX;
  bVar2 = MeshEdgebreakerTraversalDecoder::Start
                    (&this->super_MeshEdgebreakerTraversalDecoder,out_buffer);
  iVar3 = (int)CONCAT71(extraout_var,bVar2);
  if (bVar2) {
    lVar1 = out_buffer->pos_ + 4;
    if (lVar1 <= out_buffer->data_size_) {
      iVar3 = *(int *)(out_buffer->data_ + out_buffer->pos_);
      out_buffer->pos_ = lVar1;
    }
    if ((-1 < iVar3 && lVar1 <= out_buffer->data_size_) && (iVar3 < this->num_vertices_)) {
      uStack_18 = (ulong)(uint)uStack_18;
      std::vector<int,_std::allocator<int>_>::resize
                (&this->vertex_valences_,(ulong)(uint)this->num_vertices_,
                 (value_type_conflict1 *)((long)&uStack_18 + 4));
      bVar2 = RAnsBitDecoder::StartDecoding(&this->prediction_decoder_,out_buffer);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool Start(DecoderBuffer *out_buffer) {
    if (!MeshEdgebreakerTraversalDecoder::Start(out_buffer)) {
      return false;
    }
    int32_t num_split_symbols;
    if (!out_buffer->Decode(&num_split_symbols) || num_split_symbols < 0)
      return false;
    if (num_split_symbols >= num_vertices_) {
      return false;
    }
    // Set the valences of all initial vertices to 0.
    vertex_valences_.resize(num_vertices_, 0);
    if (!prediction_decoder_.StartDecoding(out_buffer)) {
      return false;
    }
    return true;
  }